

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_ReflectionHasFieldTest_Test::TestBody
          (NoFieldPresenceTest_ReflectionHasFieldTest_Test *this)

{
  bool bVar1;
  int iVar2;
  Reflection *this_00;
  Descriptor *this_01;
  char *pcVar3;
  FieldDescriptor *pFVar4;
  TestAllTypes *message_00;
  OneofDescriptor *pOVar5;
  uint32_t *puVar6;
  Arena *pAVar7;
  AssertHelper local_570;
  Message local_568;
  bool local_55a;
  bool local_559;
  undefined1 local_558 [8];
  AssertionResult gtest_ar_11;
  Message local_540;
  bool local_532;
  bool local_531;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_10;
  Message local_518;
  bool local_50a;
  bool local_509;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_9;
  Message local_4f0;
  bool local_4e2;
  bool local_4e1;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_8;
  Message local_4c8;
  bool local_4ba;
  bool local_4b9;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_7;
  Message local_4a0;
  bool local_492;
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_6;
  Message local_478;
  bool local_46a;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_5;
  Message local_450;
  bool local_442;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_4;
  Message local_428;
  bool local_41a;
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_3;
  FieldDescriptor *field_string;
  FieldDescriptor *local_3e0;
  FieldDescriptor *field_double;
  FieldDescriptor *local_3c8;
  FieldDescriptor *field_int32;
  Message local_3b8;
  bool local_3aa;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_2;
  FieldDescriptor *field_1;
  int i_1;
  Message local_380;
  bool local_372;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_1;
  FieldDescriptor *msg_field;
  Message local_340;
  bool local_332;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar;
  FieldDescriptor *field;
  int i;
  Descriptor *desc;
  Reflection *r;
  TestAllTypes message;
  NoFieldPresenceTest_ReflectionHasFieldTest_Test *this_local;
  
  message.field_0._664_8_ = this;
  proto2_nofieldpresence_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&r);
  this_00 = proto2_nofieldpresence_unittest::TestAllTypes::GetReflection();
  this_01 = proto2_nofieldpresence_unittest::TestAllTypes::GetDescriptor();
  for (field._4_4_ = 0; iVar2 = Descriptor::field_count(this_01), field._4_4_ < iVar2;
      field._4_4_ = field._4_4_ + 1) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )Descriptor::field(this_01,field._4_4_);
    bVar1 = FieldDescriptor::is_repeated
                      ((FieldDescriptor *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    if (!bVar1) {
      local_331 = false;
      local_332 = Reflection::HasField
                            (this_00,(Message *)&r,
                             (FieldDescriptor *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                ((EqHelper *)local_330,"false","r->HasField(message, field)",&local_331,&local_332);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
      if (!bVar1) {
        testing::Message::Message(&local_340);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&msg_field,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x2d8,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&msg_field,&local_340);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&msg_field);
        testing::Message::~Message(&local_340);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_1.message_,
             "optional_nested_message");
  pFVar4 = Descriptor::FindFieldByName(this_01,stack0xfffffffffffffca0);
  local_371 = false;
  message_00 = proto2_nofieldpresence_unittest::TestAllTypes::default_instance();
  local_372 = Reflection::HasField(this_00,&message_00->super_Message,pFVar4);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_370,"false",
             "r->HasField(TestAllTypes::default_instance(), msg_field)",&local_371,&local_372);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x2de,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffc78,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc78);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  FillValues((TestAllTypes *)&r);
  for (field_1._4_4_ = 0; iVar2 = Descriptor::field_count(this_01), field_1._4_4_ < iVar2;
      field_1._4_4_ = field_1._4_4_ + 1) {
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )Descriptor::field(this_01,field_1._4_4_);
    bVar1 = FieldDescriptor::is_repeated
                      ((FieldDescriptor *)
                       gtest_ar_2.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    if (((!bVar1) &&
        (pOVar5 = FieldDescriptor::containing_oneof
                            ((FieldDescriptor *)
                             gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl), pOVar5 == (OneofDescriptor *)0x0)) &&
       (bVar1 = internal::cpp::IsStringFieldWithPrivatizedAccessors
                          ((FieldDescriptor *)
                           gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl), !bVar1)) {
      local_3a9 = true;
      local_3aa = Reflection::HasField
                            (this_00,(Message *)&r,
                             (FieldDescriptor *)
                             gtest_ar_2.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
      testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                ((EqHelper *)local_3a8,"true","r->HasField(message, field)",&local_3a9,&local_3aa);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
      if (!bVar1) {
        testing::Message::Message(&local_3b8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&field_int32,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
                   ,0x2ea,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&field_int32,&local_3b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&field_int32);
        testing::Message::~Message(&local_3b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
    }
  }
  proto2_nofieldpresence_unittest::TestAllTypes::Clear((TestAllTypes *)&r);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&field_double,"optional_int32");
  local_3c8 = Descriptor::FindFieldByName(this_01,_field_double);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&field_string,"optional_double");
  local_3e0 = Descriptor::FindFieldByName(this_01,_field_string);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_3.message_,
             "optional_string");
  pFVar4 = Descriptor::FindFieldByName(this_01,stack0xfffffffffffffbf8);
  local_419 = false;
  local_41a = Reflection::HasField(this_00,(Message *)&r,local_3c8);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_418,"false","r->HasField(message, field_int32)",&local_419,&local_41a
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x2f6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  local_441 = false;
  local_442 = Reflection::HasField(this_00,(Message *)&r,local_3e0);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_440,"false","r->HasField(message, field_double)",&local_441,
             &local_442);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x2f7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_469 = false;
  local_46a = Reflection::HasField(this_00,(Message *)&r,pFVar4);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_468,"false","r->HasField(message, field_string)",&local_469,
             &local_46a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x2f8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  proto2_nofieldpresence_unittest::TestAllTypes::set_optional_int32((TestAllTypes *)&r,0x2a);
  local_491 = true;
  local_492 = Reflection::HasField(this_00,(Message *)&r,local_3c8);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_490,"true","r->HasField(message, field_int32)",&local_491,&local_492)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x2fb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  proto2_nofieldpresence_unittest::TestAllTypes::set_optional_int32((TestAllTypes *)&r,0);
  local_4b9 = false;
  local_4ba = Reflection::HasField(this_00,(Message *)&r,local_3c8);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_4b8,"false","r->HasField(message, field_int32)",&local_4b9,&local_4ba
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x2fd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  proto2_nofieldpresence_unittest::TestAllTypes::set_optional_double((TestAllTypes *)&r,42.0);
  local_4e1 = true;
  local_4e2 = Reflection::HasField(this_00,(Message *)&r,local_3e0);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_4e0,"true","r->HasField(message, field_double)",&local_4e1,&local_4e2
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x300,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  proto2_nofieldpresence_unittest::TestAllTypes::set_optional_double((TestAllTypes *)&r,0.0);
  local_509 = false;
  local_50a = Reflection::HasField(this_00,(Message *)&r,local_3e0);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_508,"false","r->HasField(message, field_double)",&local_509,
             &local_50a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_518);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x302,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  puVar6 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&message.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar6 = (byte)*puVar6 | 1;
  pAVar7 = protobuf::MessageLite::GetArena((MessageLite *)&r);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &message.field_0._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase.arena_,"test"
             ,pAVar7);
  local_531 = true;
  local_532 = Reflection::HasField(this_00,(Message *)&r,pFVar4);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_530,"true","r->HasField(message, field_string)",&local_531,&local_532
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_540);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x305,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  puVar6 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&message.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar6 = (byte)*puVar6 | 1;
  pAVar7 = protobuf::MessageLite::GetArena((MessageLite *)&r);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &message.field_0._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase.arena_,
             anon_var_dwarf_37cdd0 + 5,pAVar7);
  local_559 = false;
  local_55a = Reflection::HasField(this_00,(Message *)&r,pFVar4);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_558,"false","r->HasField(message, field_string)",&local_559,
             &local_55a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x307,pcVar3);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  proto2_nofieldpresence_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&r);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, ReflectionHasFieldTest) {
  // check that HasField reports true on all scalar fields. Check that it
  // behaves properly for message fields.

  TestAllTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  // Check initial state: scalars not present (due to need to be consistent with
  // MergeFrom()), message fields not present, oneofs not present.
  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    if (field->is_repeated()) continue;
    EXPECT_EQ(false, r->HasField(message, field));
  }

  // Test field presence of a message field on the default instance.
  const FieldDescriptor* msg_field =
      desc->FindFieldByName("optional_nested_message");
  EXPECT_EQ(false, r->HasField(TestAllTypes::default_instance(), msg_field));

  // Fill all fields, expect everything to report true (check oneofs below).
  FillValues(&message);
  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    if (field->is_repeated() || field->containing_oneof()) {
      continue;
    }
    if (internal::cpp::IsStringFieldWithPrivatizedAccessors(*field)) {
      continue;
    }
    EXPECT_EQ(true, r->HasField(message, field));
  }

  message.Clear();

  // Check zero/empty-means-not-present semantics.
  const FieldDescriptor* field_int32 = desc->FindFieldByName("optional_int32");
  const FieldDescriptor* field_double =
      desc->FindFieldByName("optional_double");
  const FieldDescriptor* field_string =
      desc->FindFieldByName("optional_string");

  EXPECT_EQ(false, r->HasField(message, field_int32));
  EXPECT_EQ(false, r->HasField(message, field_double));
  EXPECT_EQ(false, r->HasField(message, field_string));

  message.set_optional_int32(42);
  EXPECT_EQ(true, r->HasField(message, field_int32));
  message.set_optional_int32(0);
  EXPECT_EQ(false, r->HasField(message, field_int32));

  message.set_optional_double(42.0);
  EXPECT_EQ(true, r->HasField(message, field_double));
  message.set_optional_double(0.0);
  EXPECT_EQ(false, r->HasField(message, field_double));

  message.set_optional_string("test");
  EXPECT_EQ(true, r->HasField(message, field_string));
  message.set_optional_string("");
  EXPECT_EQ(false, r->HasField(message, field_string));
}